

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

Gia_Man_t *
Gia_ManQuantExist2Dup
          (Gia_Man_t *p,int iLit,Vec_Int_t *vCis,Vec_Int_t *vSide,Vec_Int_t *vAnds,int *pOutLit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int iLitR;
  int iLit1;
  int iLit0;
  int iObj;
  int i;
  int *pOutLit_local;
  Vec_Int_t *vAnds_local;
  Vec_Int_t *vSide_local;
  Vec_Int_t *vCis_local;
  int iLit_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vSide);
  iVar2 = Vec_IntSize(vCis);
  iVar3 = Vec_IntSize(vAnds);
  p_00 = Gia_ManStart(iVar1 + iVar2 + iVar3 * 10);
  Gia_ManQuantSetSuppStart(p_00);
  Gia_ManHashStart(p_00);
  iVar1 = Vec_IntSize(&p->vCopies);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 < iVar2) {
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFillExtra(&p->vCopies,iVar1,-1);
  }
  for (iLit0 = 0; iVar1 = Vec_IntSize(vSide), iLit0 < iVar1; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(vSide,iLit0);
    iVar2 = Gia_ManAppendCi(p_00);
    Gia_ObjSetCopyArray(p,iVar1,iVar2);
    Gia_ManQuantSetSuppZero(p_00);
  }
  for (iLit0 = 0; iVar1 = Vec_IntSize(vCis), iLit0 < iVar1; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(vCis,iLit0);
    iVar2 = Gia_ManAppendCi(p_00);
    Gia_ObjSetCopyArray(p,iVar1,iVar2);
    Gia_ManQuantSetSuppZero(p_00);
    iVar1 = Abc_Lit2Var(iVar2);
    pGVar5 = Gia_ManObj(p_00,iVar1);
    Gia_ManQuantSetSuppCi(p_00,pGVar5);
  }
  for (iLit0 = 0; iVar1 = Vec_IntSize(vAnds), iLit0 < iVar1; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(vAnds,iLit0);
    pGVar5 = Gia_ManObj(p,iVar1);
    iVar2 = Gia_ObjFaninId0(pGVar5,iVar1);
    iVar2 = Gia_ObjCopyArray(p,iVar2);
    iVar3 = Gia_ObjFaninId1(pGVar5,iVar1);
    iVar3 = Gia_ObjCopyArray(p,iVar3);
    iVar4 = Gia_ObjFaninC0(pGVar5);
    iVar2 = Abc_LitNotCond(iVar2,iVar4);
    iVar4 = Gia_ObjFaninC1(pGVar5);
    iVar3 = Abc_LitNotCond(iVar3,iVar4);
    iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
    Gia_ObjSetCopyArray(p,iVar1,iVar2);
  }
  iVar1 = Abc_Lit2Var(iLit);
  iVar1 = Gia_ObjCopyArray(p,iVar1);
  iVar2 = Abc_LitIsCompl(iLit);
  iVar1 = Abc_LitNotCond(iVar1,iVar2);
  if (pOutLit != (int *)0x0) {
    *pOutLit = iVar1;
  }
  for (iLit0 = 0; iVar1 = Vec_IntSize(vSide), iLit0 < iVar1; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(vSide,iLit0);
    Gia_ObjSetCopyArray(p,iVar1,-1);
  }
  for (iLit0 = 0; iVar1 = Vec_IntSize(vCis), iLit0 < iVar1; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(vCis,iLit0);
    Gia_ObjSetCopyArray(p,iVar1,-1);
  }
  for (iLit0 = 0; iVar1 = Vec_IntSize(vAnds), iLit0 < iVar1; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(vAnds,iLit0);
    Gia_ObjSetCopyArray(p,iVar1,-1);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManQuantExist2Dup( Gia_Man_t * p, int iLit, Vec_Int_t * vCis, Vec_Int_t * vSide, Vec_Int_t * vAnds, int * pOutLit )
{
    int i, iObj, iLit0, iLit1, iLitR;
    Gia_Man_t * pNew = Gia_ManStart( Vec_IntSize(vSide) + Vec_IntSize(vCis) + 10*Vec_IntSize(vAnds) );
    Gia_ManQuantSetSuppStart( pNew );
    Gia_ManHashStart( pNew ); 
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    Vec_IntForEachEntry( vSide, iObj, i )
    {
        Gia_ObjSetCopyArray( p, iObj, Gia_ManAppendCi(pNew) );
        Gia_ManQuantSetSuppZero( pNew );
    }
    Vec_IntForEachEntry( vCis,  iObj, i )
    {
        Gia_ObjSetCopyArray( p, iObj, (iLit0 = Gia_ManAppendCi(pNew)) );
        Gia_ManQuantSetSuppZero( pNew );
        Gia_ManQuantSetSuppCi( pNew, Gia_ManObj(pNew, Abc_Lit2Var(iLit0)) );
    }
    Vec_IntForEachEntry( vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
        iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
        iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
        iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
        iLitR = Gia_ManHashAnd( pNew, iLit0, iLit1 );
        Gia_ObjSetCopyArray( p, iObj, iLitR );
    }
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    if ( pOutLit ) *pOutLit = iLit0;
    Vec_IntForEachEntry( vSide, iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    Vec_IntForEachEntry( vCis,  iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    Vec_IntForEachEntry( vAnds, iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    return pNew;
}